

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.hpp
# Opt level: O3

bool __thiscall sglr::rc::Texture2DArray::isComplete(Texture2DArray *this)

{
  PixelBufferAccess *pPVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  TextureFormat *format;
  int *piVar7;
  size_t *psVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  
  uVar2 = (this->super_Texture).m_baseLevel;
  uVar6 = (ulong)uVar2;
  if ((0xd < uVar6) || ((this->m_levels).m_data[uVar6].m_cap == 0)) {
    return false;
  }
  if ((this->super_Texture).m_sampler.minFilter < NEAREST_MIPMAP_NEAREST) {
    return true;
  }
  pPVar1 = (this->m_levels).m_access + uVar6;
  uVar3 = (pPVar1->super_ConstPixelBufferAccess).m_size.m_data[0];
  uVar4 = (pPVar1->super_ConstPixelBufferAccess).m_size.m_data[1];
  uVar9 = ((this->super_Texture).m_maxLevel - uVar2) + 1;
  uVar11 = uVar4;
  if ((int)uVar4 < (int)uVar3) {
    uVar11 = uVar3;
  }
  uVar10 = 0x20;
  if (uVar11 != 0) {
    uVar10 = 0x1f;
    if (uVar11 != 0) {
      for (; uVar11 >> uVar10 == 0; uVar10 = uVar10 - 1) {
      }
    }
    uVar10 = uVar10 ^ 0x1f;
  }
  uVar11 = 0x20 - uVar10;
  if ((int)uVar9 < (int)(0x20 - uVar10)) {
    uVar11 = uVar9;
  }
  if (1 < (int)uVar11) {
    piVar7 = (this->m_levels).m_access[uVar6 + 1].super_ConstPixelBufferAccess.m_size.m_data + 2;
    psVar8 = &(this->m_levels).m_data[uVar6 + 1].m_cap;
    uVar6 = 1;
    do {
      if ((0xe - uVar2 == uVar6) || (*psVar8 == 0)) {
        return false;
      }
      iVar5 = (int)uVar3 >> ((byte)uVar6 & 0x1f);
      if (iVar5 < 2) {
        iVar5 = 1;
      }
      if (((IVec3 *)(piVar7 + -2))->m_data[0] != iVar5) {
        return false;
      }
      iVar5 = (int)uVar4 >> ((byte)uVar6 & 0x1f);
      if (iVar5 < 2) {
        iVar5 = 1;
      }
      if (piVar7[-1] != iVar5) {
        return false;
      }
      if (*piVar7 != (pPVar1->super_ConstPixelBufferAccess).m_size.m_data[2]) {
        return false;
      }
      if (piVar7[-4] != (pPVar1->super_ConstPixelBufferAccess).m_format.order) {
        return false;
      }
      if (piVar7[-3] != (pPVar1->super_ConstPixelBufferAccess).m_format.type) {
        return false;
      }
      uVar6 = uVar6 + 1;
      piVar7 = piVar7 + 10;
      psVar8 = psVar8 + 2;
    } while (uVar11 != uVar6);
  }
  return true;
}

Assistant:

int							getBaseLevel	(void) const	{ return m_baseLevel;		}